

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

void __thiscall MutableBuffer::push<short>(MutableBuffer *this,short value,size_t count)

{
  void *pvVar1;
  ushort uVar2;
  size_t sVar3;
  bool bVar4;
  
  check_size(this,count * 2 + (this->super_Buffer).size);
  pvVar1 = (this->super_Buffer).data;
  sVar3 = (this->super_Buffer).size;
  uVar2 = value << 8 | (ushort)value >> 8;
  if ((this->super_Buffer).endianess != EndianessBig) {
    uVar2 = value;
  }
  while( true ) {
    bVar4 = count == 0;
    count = count - 1;
    if (bVar4) break;
    *(ushort *)((long)pvVar1 + sVar3) = uVar2;
    (this->super_Buffer).size = sVar3 + 2;
    sVar3 = sVar3 + 2;
  }
  return;
}

Assistant:

void push(T value, size_t count = 1) {
    check_size(size + (sizeof(T) * count));
    for (size_t i = 0; i < count; i++) {
      *(reinterpret_cast<T*>(offset(size))) = (endianess == EndianessBig) ?
                                                htobe(value) :
                                                htole(value);
      size += sizeof(T);
    }
  }